

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O0

void __thiscall gdsForge::gdsPath(gdsForge *this,gdsPATH *in_PATH,bool minimal)

{
  long lVar1;
  gdsForge *pgVar2;
  int *arrInt;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  string *psVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  undefined8 uStack_90;
  string *local_88;
  ulong local_80;
  gdsForge *local_78;
  int *local_70;
  string local_58;
  int local_34;
  long lStack_30;
  int i;
  unsigned_long __vla_expr0;
  uint local_20;
  byte local_19;
  int data [1];
  bool minimal_local;
  gdsPATH *in_PATH_local;
  gdsForge *this_local;
  
  uStack_90 = 0x122d6f;
  local_78 = this;
  local_19 = minimal;
  _data = in_PATH;
  sVar4 = std::vector<int,_std::allocator<int>_>::size(&in_PATH->xCor);
  pgVar2 = local_78;
  lStack_30 = sVar4 * 2;
  lVar1 = -(sVar4 * 8 + 0xf & 0xfffffffffffffff0);
  local_70 = (int *)((long)&local_88 + lVar1);
  __vla_expr0 = (unsigned_long)&local_88;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122daa;
  GDSwriteRec(pgVar2,0x900);
  pgVar2 = local_78;
  if ((local_19 & 1) == 0) {
    local_20 = _data->plex;
    *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122dd7;
    GDSwriteInt(pgVar2,0x2f03,(int *)&local_20,1);
  }
  pgVar2 = local_78;
  local_20 = _data->layer;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122df8;
  GDSwriteInt(pgVar2,0xd02,(int *)&local_20,1);
  pgVar2 = local_78;
  local_20 = _data->dataType;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122e19;
  GDSwriteInt(pgVar2,0xe02,(int *)&local_20,1);
  pgVar2 = local_78;
  local_20 = _data->pathtype;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122e3a;
  GDSwriteInt(pgVar2,0x2102,(int *)&local_20,1);
  pgVar2 = local_78;
  local_20 = _data->width;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122e5b;
  GDSwriteInt(pgVar2,0xf03,(int *)&local_20,1);
  local_34 = 0;
  while( true ) {
    local_80 = (ulong)local_34;
    pvVar7 = &_data->xCor;
    *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122e77;
    sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
    if (sVar4 << 1 <= local_80) break;
    if (local_34 % 2 == 0) {
      pvVar7 = &_data->xCor;
      iVar3 = local_34 / 2;
      *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122ede;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)iVar3);
      local_70[local_34] = *pvVar5;
    }
    else {
      pvVar7 = &_data->yCor;
      iVar3 = local_34 / 2;
      *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122eb1;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)iVar3);
      local_70[local_34] = *pvVar5;
    }
    local_34 = local_34 + 1;
  }
  pvVar7 = &_data->xCor;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122f0b;
  sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
  arrInt = local_70;
  pgVar2 = local_78;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122f22;
  GDSwriteInt(pgVar2,0x1003,arrInt,(int)(sVar4 << 1));
  pgVar2 = local_78;
  if ((local_19 & 1) == 0) {
    local_20 = _data->propattr;
    *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122f50;
    GDSwriteInt(pgVar2,0x2b02,(int *)&local_20,1);
    psVar6 = &_data->propvalue;
    local_88 = &local_58;
    *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122f65;
    std::__cxx11::string::string((string *)&local_58,(string *)psVar6);
    pgVar2 = local_78;
    psVar6 = local_88;
    *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122f77;
    GDSwriteStr(pgVar2,0x2c06,psVar6);
    *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122f82;
    std::__cxx11::string::~string((string *)&local_58);
  }
  pgVar2 = local_78;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x122fa9;
  GDSwriteRec(pgVar2,0x1100);
  return;
}

Assistant:

void gdsForge::gdsPath(const gdsPATH &in_PATH, bool minimal)
{
  int data[1];
  int corXY[in_PATH.xCor.size() * 2];

  this->GDSwriteRec(GDS_PATH);

  // ELFLAGS and PLEX are optional
  if (minimal == false) {
    data[0] = in_PATH.plex;
    this->GDSwriteInt(GDS_PLEX, data, 1);
  }

  // Layer number, 0 to 63
  data[0] = in_PATH.layer;
  this->GDSwriteInt(GDS_LAYER, data, 1);

  // unimportant, set to zero.
  data[0] = in_PATH.dataType;
  this->GDSwriteInt(GDS_DATATYPE, data, 1);

  data[0] = in_PATH.pathtype;
  this->GDSwriteInt(GDS_PATHTYPE, data, 1);

  // Width of tracks
  data[0] = in_PATH.width;
  this->GDSwriteInt(GDS_WIDTH, data, 1);

  // XY coordinates
  // boundary must be closed, first and last coordinate must be the same
  // minimum of 4 points(triangle)
  for (int i = 0; i < in_PATH.xCor.size() * 2; i++) {
    if (i % 2) {
      corXY[i] = in_PATH.yCor[i / 2];
    } else {
      corXY[i] = in_PATH.xCor[i / 2];
    }
  }

  this->GDSwriteInt(GDS_XY, corXY, in_PATH.xCor.size() * 2);

  // Optional goodies
  if (minimal == false) { // false
    data[0] = in_PATH.propattr;
    this->GDSwriteInt(GDS_PROPATTR, data, 1);

    this->GDSwriteStr(GDS_PROPVALUE, in_PATH.propvalue);
  }

  this->GDSwriteRec(GDS_ENDEL);
}